

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_clrsb(Terminal *term)

{
  void *ptr;
  termline *line;
  wchar_t y;
  tree234 *t;
  
  term->disptop = L'\0';
  t = term->scrollback;
  while( true ) {
    ptr = delpos234(t,0);
    if (ptr == (void *)0x0) break;
    safefree(ptr);
    t = term->scrollback;
  }
  if (L'\0' < term->rows) {
    y = L'\0';
    do {
      line = lineptr(term,y,L'ۭ',L'\x01');
      if (term->cols != line->cols) {
        resizeline(term,line,term->cols);
      }
      y = y + L'\x01';
    } while (y < term->rows);
  }
  if ((term->selstate != LEXICOGRAPHIC) && ((term->selstart).y < L'\0')) {
    term->selstate = LEXICOGRAPHIC;
    (term->selstart).y = L'\0';
    (term->selstart).x = L'\0';
    (term->selend).y = L'\0';
    (term->selend).x = L'\0';
  }
  term->tempsblines = L'\0';
  term->alt_sblines = L'\0';
  term->win_scrollbar_update_pending = true;
  if (term->window_update_pending != false) {
    return;
  }
  term->window_update_pending = true;
  queue_toplevel_callback(term_update_callback,term);
  return;
}

Assistant:

void term_clrsb(Terminal *term)
{
    unsigned char *line;
    int i;

    /*
     * Scroll forward to the current screen, if we were back in the
     * scrollback somewhere until now.
     */
    term->disptop = 0;

    /*
     * Clear the actual scrollback.
     */
    while ((line = delpos234(term->scrollback, 0)) != NULL) {
        sfree(line);            /* this is compressed data, not a termline */
    }

    /*
     * When clearing the scrollback, we also truncate any termlines on
     * the current screen which have remembered data from a previous
     * larger window size. Rationale: clearing the scrollback is
     * sometimes done to protect privacy, so the user intention is
     * specifically that we should not retain evidence of what
     * previously happened in the terminal, and that ought to include
     * evidence to the right as well as evidence above.
     */
    for (i = 0; i < term->rows; i++)
        check_line_size(term, scrlineptr(i));

    /*
     * That operation has invalidated the selection, if it overlapped
     * the scrollback at all.
     */
    if (term->selstate != NO_SELECTION && term->selstart.y < 0)
        deselect(term);

    /*
     * There are now no lines of real scrollback which can be pulled
     * back into the screen by a resize, and no lines of the alternate
     * screen which should be displayed as if part of the scrollback.
     */
    term->tempsblines = 0;
    term->alt_sblines = 0;

    /*
     * The scrollbar will need updating to reflect the new state of
     * the world.
     */
    term->win_scrollbar_update_pending = true;
    term_schedule_update(term);
}